

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QTimeZone *tz)

{
  long lVar1;
  QDebug *pQVar2;
  anon_class_1_0_00000001 *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 asIs;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff8f;
  QDebugStateSaver *in_stack_ffffffffffffff90;
  Stream *pSVar3;
  anon_class_1_0_00000001 *wrap;
  Stream *out;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar3 = in_RDI;
  wrap = in_RSI;
  out = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)in_RSI,(QDebug *)in_RDI);
  uVar4 = 0xaa;
  pQVar2 = QDebug::nospace((QDebug *)in_RSI);
  QDebug::operator<<(pQVar2,(char *)CONCAT17(uVar4,in_stack_ffffffffffffffe8));
  QTimeZone::Data::operator<<((Data *)CONCAT17(uVar4,in_stack_ffffffffffffffe8),(QDebug *)out,wrap);
  pQVar2 = QDebug::nospace((QDebug *)in_RSI);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  QDebug::QDebug((QDebug *)in_RDI,pQVar2);
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)pSVar3;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QTimeZone &tz)
{
    QDebugStateSaver saver(dbg);
    const auto asIs = [](const char *text) { return text; };
    // TODO Include backend and data version details?
    dbg.nospace() << "QTimeZone(";
    tz.d.serialize(dbg, asIs);
    dbg.nospace() << ')';
    return dbg;
}